

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parse(FfsParser *this,UByteArray *buffer)

{
  bool bVar1;
  UModelIndex local_98;
  CBString local_80;
  USTATUS local_68;
  USTATUS result;
  uint64_t local_58;
  TreeModel *local_50;
  UModelIndex local_48;
  undefined1 local_30 [8];
  UModelIndex root;
  UByteArray *buffer_local;
  FfsParser *this_local;
  
  root.m = (TreeModel *)buffer;
  UModelIndex::UModelIndex((UModelIndex *)local_30);
  UByteArray::operator=(&this->openedImage,(UByteArray *)root.m);
  this->imageBase = 0;
  this->addressDiff = 0x100000000;
  this->protectedRegionsBase = 0;
  Bstrlib::CBString::operator=(&this->securityInfo,anon_var_dwarf_23d28 + 0x10);
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::clear(&this->protectedRanges);
  UModelIndex::UModelIndex(&local_48);
  (this->lastVtf).r = local_48.r;
  (this->lastVtf).c = local_48.c;
  (this->lastVtf).i = local_48.i;
  (this->lastVtf).m = local_48.m;
  UModelIndex::UModelIndex((UModelIndex *)&result);
  (this->dxeCore).r = (undefined4)result;
  (this->dxeCore).c = result._4_4_;
  (this->dxeCore).i = local_58;
  (this->dxeCore).m = local_50;
  local_68 = performFirstPass(this,(UByteArray *)root.m,(UModelIndex *)local_30);
  if (local_68 == 0) {
    bVar1 = UModelIndex::isValid(&this->lastVtf);
    if (bVar1) {
      local_68 = performSecondPass(this,(UModelIndex *)local_30);
    }
    else {
      usprintf(&local_80,"%s: not a single Volume Top File is found, the image may be corrupted",
               "parse");
      UModelIndex::UModelIndex(&local_98);
      msg(this,&local_80,&local_98);
      Bstrlib::CBString::~CBString(&local_80);
    }
  }
  addInfoRecursive(this,(UModelIndex *)local_30);
  return local_68;
}

Assistant:

USTATUS FfsParser::parse(const UByteArray & buffer)
{
    UModelIndex root;
    
    // Reset global parser state
    openedImage = buffer;
    imageBase = 0;
    addressDiff = 0x100000000ULL;
    protectedRegionsBase = 0;
    securityInfo = "";
    protectedRanges.clear();
    lastVtf = UModelIndex();
    dxeCore = UModelIndex();
    
    // Parse input buffer
    USTATUS result = performFirstPass(buffer, root);
    if (result == U_SUCCESS) {
        if (lastVtf.isValid()) {
            result = performSecondPass(root);
        }
        else {
            msg(usprintf("%s: not a single Volume Top File is found, the image may be corrupted", __FUNCTION__));
        }
    }
    
    addInfoRecursive(root);
    return result;
}